

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchMan.c
# Opt level: O2

void Dch_ManPrintStats(Dch_Man_t *p)

{
  Dch_Pars_t *pDVar1;
  long lVar2;
  ulong uVar3;
  abctime Time;
  uint uVar4;
  int iVar5;
  int level;
  Dch_Man_t *pDVar6;
  
  pDVar1 = p->pPars;
  uVar3 = (long)(p->pAigTotal->nObjs[6] + p->pAigTotal->nObjs[5]) / 3;
  pDVar6 = p;
  Abc_Print((int)p,"Parameters: Sim words = %d. Conf limit = %d. SAT var max = %d.\n",
            (ulong)(uint)pDVar1->nWords,(ulong)(uint)pDVar1->nBTLimit,
            (ulong)(uint)pDVar1->nSatVarMax);
  uVar4 = p->pAigTotal->nObjs[6] + p->pAigTotal->nObjs[5];
  iVar5 = (int)uVar3;
  level = (int)pDVar6;
  Abc_Print(level,"AIG nodes : Total = %6d. Dangling = %6d. Main = %6d. (%6.2f %%)\n",
            ((double)iVar5 * 100.0) / (double)(int)uVar4,(ulong)uVar4,(ulong)(uVar4 - iVar5),
            uVar3 & 0xffffffff);
  Abc_Print(level,"SAT solver: Vars = %d. Max cone = %d. Recycles = %d.\n",(ulong)(uint)p->nSatVars,
            (ulong)(uint)p->nConeMax,(ulong)(uint)p->nRecycles);
  Abc_Print(level,"SAT calls : All = %6d. Unsat = %6d. Sat = %6d. Fail = %6d.\n",
            (ulong)(uint)p->nSatCalls,
            (ulong)(uint)((p->nSatCalls - p->nSatCallsSat) - p->nSatFailsReal));
  Abc_Print(level,"Choices   : Lits = %6d. Reprs = %5d. Equivs = %5d. Choices = %5d.\n",
            (ulong)(uint)p->nLits,(ulong)(uint)p->nReprs,(ulong)(uint)p->nEquivs,
            (ulong)(uint)p->nChoices);
  Abc_Print(level,"Choicing runtime statistics:\n");
  Time = p->timeTotal - (long)((char *)p->timeSimInit + p->timeChoice + p->timeSat + p->timeSimSat);
  p->timeOther = Time;
  Abc_PrintTimeP(0x7d79b0,(char *)p->timeSimInit,p->timeTotal,Time);
  Abc_PrintTimeP(0x7d79bc,(char *)p->timeSimSat,p->timeTotal,Time);
  Abc_PrintTimeP(0x6f224e,(char *)p->timeSat,p->timeTotal,Time);
  Abc_PrintTimeP(0x7c6d4b,(char *)p->timeSatSat,p->timeTotal,Time);
  Abc_PrintTimeP(0x7c6d3f,(char *)p->timeSatUnsat,p->timeTotal,Time);
  Abc_PrintTimeP(0x7d79c8,(char *)p->timeSatUndec,p->timeTotal,Time);
  Abc_PrintTimeP(0x7d79d4,(char *)p->timeChoice,p->timeTotal,Time);
  Abc_PrintTimeP(0x7d25d5,(char *)p->timeOther,p->timeTotal,Time);
  iVar5 = 0x6f4006;
  Abc_PrintTimeP(0x6f4006,(char *)p->timeTotal,p->timeTotal,Time);
  lVar2 = p->pPars->timeSynth;
  if (lVar2 != 0) {
    Abc_Print(iVar5,"%s =","Synthesis  ");
    Abc_Print(iVar5,"%9.2f sec\n",(double)lVar2 / 1000000.0);
    return;
  }
  return;
}

Assistant:

void Dch_ManPrintStats( Dch_Man_t * p )
{
    int nNodeNum = Aig_ManNodeNum(p->pAigTotal) / 3;
    Abc_Print( 1, "Parameters: Sim words = %d. Conf limit = %d. SAT var max = %d.\n", 
        p->pPars->nWords, p->pPars->nBTLimit, p->pPars->nSatVarMax );
    Abc_Print( 1, "AIG nodes : Total = %6d. Dangling = %6d. Main = %6d. (%6.2f %%)\n", 
        Aig_ManNodeNum(p->pAigTotal), 
        Aig_ManNodeNum(p->pAigTotal)-nNodeNum,
        nNodeNum,
        100.0 * nNodeNum/Aig_ManNodeNum(p->pAigTotal) );
    Abc_Print( 1, "SAT solver: Vars = %d. Max cone = %d. Recycles = %d.\n", 
        p->nSatVars, p->nConeMax, p->nRecycles );
    Abc_Print( 1, "SAT calls : All = %6d. Unsat = %6d. Sat = %6d. Fail = %6d.\n", 
        p->nSatCalls, p->nSatCalls-p->nSatCallsSat-p->nSatFailsReal, 
        p->nSatCallsSat, p->nSatFailsReal );
    Abc_Print( 1, "Choices   : Lits = %6d. Reprs = %5d. Equivs = %5d. Choices = %5d.\n", 
        p->nLits, p->nReprs, p->nEquivs, p->nChoices );
    Abc_Print( 1, "Choicing runtime statistics:\n" );
    p->timeOther = p->timeTotal-p->timeSimInit-p->timeSimSat-p->timeSat-p->timeChoice;
    Abc_PrintTimeP( 1, "Sim init   ", p->timeSimInit,  p->timeTotal );
    Abc_PrintTimeP( 1, "Sim SAT    ", p->timeSimSat,   p->timeTotal );
    Abc_PrintTimeP( 1, "SAT solving", p->timeSat,      p->timeTotal );
    Abc_PrintTimeP( 1, "  sat      ", p->timeSatSat,   p->timeTotal );
    Abc_PrintTimeP( 1, "  unsat    ", p->timeSatUnsat, p->timeTotal );
    Abc_PrintTimeP( 1, "  undecided", p->timeSatUndec, p->timeTotal );
    Abc_PrintTimeP( 1, "Choice     ", p->timeChoice,   p->timeTotal );
    Abc_PrintTimeP( 1, "Other      ", p->timeOther,    p->timeTotal );
    Abc_PrintTimeP( 1, "TOTAL      ", p->timeTotal,    p->timeTotal );
    if ( p->pPars->timeSynth )
    {
    Abc_PrintTime( 1, "Synthesis  ", p->pPars->timeSynth );
    }
}